

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O0

void __thiscall RefCount::Release(RefCount *this)

{
  RefCount *this_local;
  
  Mutex::EnterCriticalSection();
  this->mRefCount = this->mRefCount + -1;
  if (this->mRefCount == 0) {
    Mutex::ExitCriticalSection();
    (**this->_vptr_RefCount)();
  }
  else {
    Mutex::ExitCriticalSection();
  }
  return;
}

Assistant:

void Release() const
	{
		Mutex::EnterCriticalSection();
		mRefCount--; 
		//printf( "%p Release %d\n", this, mRefCount );
		if ( mRefCount == 0 )
		{
			Mutex::ExitCriticalSection();
			onRefCountZero();
		}
		else
			Mutex::ExitCriticalSection();
	}